

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

basic_node_ptr<unodb::detail::olc_node_header> __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::leave_last_child(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   *this,uint8_t child_to_delete,db_type *db_instance)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 local_20 [8];
  leaf_reclaimable_ptr r;
  
  if (this->field_0x20 != '\x02') {
    __assert_fail("this->is_min_size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x59f,
                  "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::leave_last_child(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (child_to_delete < 2) {
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db_instance =
         (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )((this->children)._M_elems[child_to_delete].value._M_i.tagged_ptr & 0xfffffffffffffff8);
    uVar2 = (ulong)child_to_delete ^ 1;
    uVar1 = (this->children)._M_elems[uVar2].value._M_i.tagged_ptr;
    local_20 = (undefined1  [8])db_instance;
    if ((uVar1 & 7) != 0) {
      key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
      ::prepend((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                 *)((uVar1 & 0xfffffffffffffff8) + 0x18),
                (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                 *)&this->field_0x18,*(byte *)((long)(this->children)._M_elems + (uVar2 - 4)));
    }
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_20);
    return (basic_node_ptr<unodb::detail::olc_node_header>)uVar1;
  }
  __assert_fail("child_to_delete == 0 || child_to_delete == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x5a1,
                "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::leave_last_child(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

[[nodiscard]] constexpr auto leave_last_child(std::uint8_t child_to_delete,
                                                db_type &db_instance) noexcept {
    UNODB_DETAIL_ASSERT(this->is_min_size());
    // NOLINTNEXTLINE(readability-simplify-boolean-expr)
    UNODB_DETAIL_ASSERT(child_to_delete == 0 || child_to_delete == 1);

    auto *const child_to_delete_ptr{
        children[child_to_delete].load().template ptr<leaf_type *>()};
    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(child_to_delete_ptr,
                                                       db_instance)};

    const std::uint8_t child_to_leave = (child_to_delete == 0) ? 1U : 0U;
    const auto child_to_leave_ptr = children[child_to_leave].load();
    if (child_to_leave_ptr.type() != node_type::LEAF) {
      auto *const inode_to_leave_ptr{
          child_to_leave_ptr.template ptr<inode_type *>()};
      inode_to_leave_ptr->get_key_prefix().prepend(
          this->get_key_prefix(), keys.byte_array[child_to_leave]);
    }
    return child_to_leave_ptr;
  }